

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O3

void __thiscall rcg::System::clearInterfaces(System *this)

{
  pointer psVar1;
  int in_ESI;
  ulong uVar2;
  long lVar3;
  
  psVar1 = (this->ilist).
           super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->ilist).
      super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      Interface::close(*(Interface **)
                        ((long)&(psVar1->
                                super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr + lVar3),in_ESI);
      uVar2 = uVar2 + 1;
      psVar1 = (this->ilist).
               super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x10;
    } while (uVar2 < (ulong)((long)(this->ilist).
                                   super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4));
  }
  std::vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>::
  clear(&this->ilist);
  return;
}

Assistant:

void System::clearInterfaces()
{
  // close and clear all interfaces as part of ENUM-WORKAROUND
  for (size_t i=0; i<ilist.size(); i++)
  {
    ilist[i]->close();
  }

  ilist.clear();
}